

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O2

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_mul>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  undefined1 auVar7 [32];
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  
  uVar3 = a->c;
  iVar11 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar8 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    iVar8 = 0;
    uVar17 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar17 = 0;
    }
    for (uVar9 = 0; uVar9 != uVar17; uVar9 = uVar9 + 1) {
      lVar10 = a->elemsize * a->cstep * uVar9;
      pvVar4 = a->data;
      lVar12 = b->elemsize * b->cstep * uVar9;
      pvVar5 = b->data;
      lVar13 = c->elemsize * c->cstep * uVar9;
      pvVar6 = c->data;
      lVar14 = 0;
      lVar15 = 0;
      for (iVar16 = 0; iVar16 + 7 < iVar11; iVar16 = iVar16 + 8) {
        pfVar1 = (float *)((long)pvVar5 + lVar15 + lVar12);
        pfVar2 = (float *)((long)pvVar4 + lVar15 + lVar10);
        auVar7._4_4_ = pfVar1[1] * pfVar2[1];
        auVar7._0_4_ = *pfVar1 * *pfVar2;
        auVar7._8_4_ = pfVar1[2] * pfVar2[2];
        auVar7._12_4_ = pfVar1[3] * pfVar2[3];
        auVar7._16_4_ = pfVar1[4] * pfVar2[4];
        auVar7._20_4_ = pfVar1[5] * pfVar2[5];
        auVar7._24_4_ = pfVar1[6] * pfVar2[6];
        auVar7._28_4_ = pfVar1[7];
        *(undefined1 (*) [32])((long)pvVar6 + lVar15 + lVar13) = auVar7;
        lVar15 = lVar15 + 0x20;
        lVar14 = lVar14 + 8;
      }
      for (; iVar16 + 3 < iVar11; iVar16 = iVar16 + 4) {
        pfVar1 = (float *)((long)pvVar5 + lVar15 + lVar12);
        pfVar2 = (float *)((long)pvVar4 + lVar15 + lVar10);
        auVar18._0_4_ = *pfVar1 * *pfVar2;
        auVar18._4_4_ = pfVar1[1] * pfVar2[1];
        auVar18._8_4_ = pfVar1[2] * pfVar2[2];
        auVar18._12_4_ = pfVar1[3] * pfVar2[3];
        *(undefined1 (*) [16])((long)pvVar6 + lVar15 + lVar13) = auVar18;
        lVar15 = lVar15 + 0x10;
        lVar14 = lVar14 + 4;
      }
      for (; (int)lVar14 < iVar11; lVar14 = lVar14 + 1) {
        *(float *)((long)pvVar6 + lVar14 * 4 + lVar13) =
             *(float *)((long)pvVar5 + lVar14 * 4 + lVar12) *
             *(float *)((long)pvVar4 + lVar14 * 4 + lVar10);
      }
    }
  }
  return iVar8;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}